

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O1

FxExpression * ParseRandom2(FScanner *sc,PClassActor *cls)

{
  bool bVar1;
  FRandom *r;
  FxExpression *m;
  FxRandom2 *this;
  FScriptPosition FStack_38;
  
  r = ParseRNG(sc);
  FScanner::MustGetToken(sc,0x28);
  bVar1 = FScanner::CheckToken(sc,0x29);
  if (bVar1) {
    m = (FxExpression *)0x0;
  }
  else {
    m = ParseExpressionM(sc,cls);
    FScanner::MustGetToken(sc,0x29);
  }
  this = (FxRandom2 *)FMemArena::Alloc(&FxAlloc,0x40);
  FScriptPosition::FScriptPosition(&FStack_38,sc);
  FxRandom2::FxRandom2(this,r,m,&FStack_38,true);
  FString::~FString(&FStack_38.FileName);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseRandom2(FScanner &sc, PClassActor *cls)
{
	FRandom *rng = ParseRNG(sc);
	FxExpression *mask = NULL;

	sc.MustGetToken('(');

	if (!sc.CheckToken(')'))
	{
		mask = ParseExpressionM(sc, cls);
		sc.MustGetToken(')');
	}
	return new FxRandom2(rng, mask, sc, true);
}